

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonteCarloPricer.h
# Opt level: O0

PriceCI * __thiscall
MonteCarloPricer::price<AsianArithmeticPut>
          (PriceCI *__return_storage_ptr__,MonteCarloPricer *this,BlackScholesModel *model,
          AsianArithmeticPut *option)

{
  AsianArithmeticPut *this_00;
  double extraout_XMM0_Qa;
  double dVar1;
  double dVar2;
  double local_60;
  double payoff_std;
  double payoff_mean;
  int local_44;
  double dStack_40;
  int i;
  double payoff_sq_mean;
  double payoff_sum;
  double payoff;
  Option *local_20;
  AsianArithmeticPut *option_local;
  BlackScholesModel *model_local;
  MonteCarloPricer *this_local;
  
  local_20 = (Option *)option;
  option_local = (AsianArithmeticPut *)model;
  model_local = (BlackScholesModel *)this;
  payoff = Option::getMaturity((Option *)option);
  BlackScholesModel::generatePath(model,&payoff,this->prices_vector);
  payoff_sq_mean = 0.0;
  dStack_40 = 0.0;
  for (local_44 = 0; this_00 = option_local, local_44 < this->num_sims; local_44 = local_44 + 1) {
    payoff_mean = Option::getMaturity(local_20);
    BlackScholesModel::generatePath((BlackScholesModel *)this_00,&payoff_mean,this->prices_vector);
    (*local_20->_vptr_Option[1])(local_20,this->prices_vector);
    payoff_sq_mean = extraout_XMM0_Qa + payoff_sq_mean;
    dStack_40 = extraout_XMM0_Qa * extraout_XMM0_Qa + dStack_40;
  }
  payoff_std = payoff_sq_mean / (double)this->num_sims;
  local_60 = -payoff_std * payoff_std + dStack_40 / (double)this->num_sims;
  dVar1 = BlackScholesModel::getRiskFreeRate((BlackScholesModel *)option_local);
  dVar2 = Option::getMaturity(local_20);
  dVar1 = exp(-dVar1 * dVar2);
  payoff_std = dVar1 * payoff_std;
  dVar1 = BlackScholesModel::getRiskFreeRate((BlackScholesModel *)option_local);
  dVar2 = Option::getMaturity(local_20);
  dVar1 = exp(dVar1 * -2.0 * dVar2);
  local_60 = dVar1 * local_60;
  PriceCI::PriceCI(__return_storage_ptr__,&payoff_std,&local_60,&this->num_sims);
  return __return_storage_ptr__;
}

Assistant:

inline PriceCI MonteCarloPricer::price(BlackScholesModel const& model, T const& option)
{
	model.generatePath(option.getMaturity(), *prices_vector);

	double payoff, payoff_sum = 0.0, payoff_sq_mean = 0.0;
	for (int i = 0; i < num_sims; i++) {
		model.generatePath(option.getMaturity(), *prices_vector);
		payoff = option.payoff(*prices_vector);
		payoff_sum += payoff;
		payoff_sq_mean += payoff * payoff;
	}
	double payoff_mean = payoff_sum / static_cast<double>(num_sims);
	double payoff_std = (payoff_sq_mean / static_cast<double>(num_sims)) - payoff_mean * payoff_mean;
	payoff_mean *= exp(-model.getRiskFreeRate() * option.getMaturity());
	payoff_std *= exp(-2 * model.getRiskFreeRate() * option.getMaturity());
	return { payoff_mean, payoff_std, num_sims };
}